

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stripctrl.c
# Opt level: O0

StripCtrlChars *
stripctrl_new_term_fn
          (BinarySink *bs_out,_Bool permit_cr,wchar_t substitution,Terminal *term,
          _func_unsigned_long_Terminal_ptr_term_utf8_decode_ptr_uchar *translate)

{
  StripCtrlCharsImpl *pSVar1;
  StripCtrlCharsImpl *scc;
  _func_unsigned_long_Terminal_ptr_term_utf8_decode_ptr_uchar *translate_local;
  Terminal *term_local;
  wchar_t substitution_local;
  _Bool permit_cr_local;
  BinarySink *bs_out_local;
  
  pSVar1 = stripctrl_new_common(bs_out,permit_cr,substitution);
  pSVar1->term = term;
  pSVar1->translate = translate;
  (pSVar1->public).binarysink_[0].write = stripctrl_term_BinarySink_write;
  (pSVar1->public).binarysink_[0].writefmtv =
       (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0x0;
  (pSVar1->public).binarysink_[0].binarysink_ = (pSVar1->public).binarysink_;
  return &pSVar1->public;
}

Assistant:

StripCtrlChars *stripctrl_new_term_fn(
    BinarySink *bs_out, bool permit_cr, wchar_t substitution,
    Terminal *term, unsigned long (*translate)(
        Terminal *, term_utf8_decode *, unsigned char))
{
    StripCtrlCharsImpl *scc = stripctrl_new_common(
        bs_out, permit_cr, substitution);
    scc->term = term;
    scc->translate = translate;
    BinarySink_INIT(&scc->public, stripctrl_term_BinarySink_write);
    return &scc->public;
}